

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.cc
# Opt level: O3

void absl::RemoveExtraAsciiWhitespace(string *str)

{
  ulong uVar1;
  byte *pbVar2;
  char *in_RDX;
  byte *pbVar3;
  ulong extraout_RDX;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  byte bVar7;
  byte *pbVar8;
  char *pcVar9;
  byte bVar10;
  string_view sVar11;
  
  sVar11._M_str = in_RDX;
  sVar11._M_len = (size_t)(str->_M_dataplus)._M_p;
  sVar11 = StripLeadingAsciiWhitespace((absl *)str->_M_string_length,sVar11);
  pbVar3 = (byte *)sVar11._M_str;
  uVar1 = sVar11._M_len;
  pbVar2 = pbVar3 + uVar1;
  pbVar8 = pbVar2;
  if (0 < (long)uVar1 >> 2) {
    pbVar8 = pbVar3 + ((uint)sVar11._M_len & 3);
    lVar4 = ((long)uVar1 >> 2) + 1;
    do {
      if ((ascii_internal::kPropertyBits[pbVar2[-1]] & 8) == 0) goto LAB_00104f10;
      if ((ascii_internal::kPropertyBits[pbVar2[-2]] & 8) == 0) {
        pbVar2 = pbVar2 + -1;
        goto LAB_00104f10;
      }
      if ((ascii_internal::kPropertyBits[pbVar2[-3]] & 8) == 0) {
        pbVar2 = pbVar2 + -2;
        goto LAB_00104f10;
      }
      if ((ascii_internal::kPropertyBits[pbVar2[-4]] & 8) == 0) {
        pbVar2 = pbVar2 + -3;
        goto LAB_00104f10;
      }
      pbVar2 = pbVar2 + -4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = (long)pbVar8 - (long)pbVar3;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pbVar2 = pbVar3;
      if ((lVar4 != 3) || (pbVar2 = pbVar8, (ascii_internal::kPropertyBits[pbVar8[-1]] & 8) == 0))
      goto LAB_00104f10;
      pbVar8 = pbVar8 + -1;
    }
    pbVar2 = pbVar8;
    if ((ascii_internal::kPropertyBits[pbVar8[-1]] & 8) == 0) goto LAB_00104f10;
    pbVar8 = pbVar8 + -1;
  }
  pbVar2 = pbVar8;
  if ((ascii_internal::kPropertyBits[pbVar8[-1]] & 8) != 0) {
    pbVar2 = pbVar3;
  }
LAB_00104f10:
  uVar5 = (long)pbVar2 - (long)pbVar3;
  if (uVar1 < (ulong)((long)pbVar2 - (long)pbVar3)) {
    uVar5 = uVar1;
  }
  if (uVar5 == 0) {
    str->_M_string_length = 0;
    pbVar2 = (byte *)(str->_M_dataplus)._M_p;
  }
  else {
    pbVar8 = (byte *)(str->_M_dataplus)._M_p;
    pbVar2 = pbVar8;
    if (0 < (long)uVar5) {
      pbVar2 = pbVar3 + uVar5;
      bVar7 = 0;
      do {
        bVar10 = (ascii_internal::kPropertyBits[*pbVar3] & 8) >> 3;
        pbVar8[-(ulong)(bVar7 & bVar10)] = *pbVar3;
        pbVar8 = pbVar8 + -(ulong)(bVar7 & bVar10) + 1;
        pbVar3 = pbVar3 + 1;
        bVar7 = bVar10;
      } while (pbVar3 < pbVar2);
      pbVar2 = (byte *)(str->_M_dataplus)._M_p;
    }
    uVar1 = (long)pbVar8 - (long)pbVar2;
    if (str->_M_string_length < uVar1) {
      pcVar9 = "%s: __pos (which is %zu) > this->size() (which is %zu)";
      pcVar6 = "basic_string::erase";
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 uVar1);
      if (extraout_RDX < 0x10) {
        if (extraout_RDX != 0) {
          uVar1 = 0;
          do {
            pcVar9[uVar1] = ((byte)(pcVar6[uVar1] + 0xbfU) < 0x1a) << 5 ^ pcVar6[uVar1];
            uVar1 = uVar1 + 1;
          } while (extraout_RDX != uVar1);
        }
      }
      else {
        uVar1 = 0;
        do {
          pcVar9[uVar1] = ((char)(pcVar6[uVar1] + 0x3fU) < -0x66) << 5 ^ pcVar6[uVar1];
          uVar1 = uVar1 + 1;
        } while (extraout_RDX != uVar1);
      }
      return;
    }
    str->_M_string_length = uVar1;
    pbVar2 = pbVar2 + uVar1;
  }
  *pbVar2 = 0;
  return;
}

Assistant:

void RemoveExtraAsciiWhitespace(std::string* absl_nonnull str) {
  auto stripped = StripAsciiWhitespace(*str);

  if (stripped.empty()) {
    str->clear();
    return;
  }

  auto input_it = stripped.begin();
  auto input_end = stripped.end();
  auto output_it = &(*str)[0];
  bool is_ws = false;

  for (; input_it < input_end; ++input_it) {
    if (is_ws) {
      // Consecutive whitespace?  Keep only the last.
      is_ws = absl::ascii_isspace(static_cast<unsigned char>(*input_it));
      if (is_ws) --output_it;
    } else {
      is_ws = absl::ascii_isspace(static_cast<unsigned char>(*input_it));
    }

    *output_it = *input_it;
    ++output_it;
  }

  str->erase(static_cast<size_t>(output_it - &(*str)[0]));
}